

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

string * __thiscall
BasePort::PortTypeString_abi_cxx11_(string *__return_storage_ptr__,BasePort *this,PortType portType)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "Firewire";
    __a = &local_9;
    break;
  case 1:
    __s = "Ethernet-UDP";
    __a = &local_b;
    break;
  case 2:
    __s = "Ethernet-Raw";
    __a = &local_a;
    break;
  case 3:
    __s = "Zynq-EMIO";
    __a = &local_c;
    break;
  default:
    __s = "Unknown";
    __a = &local_d;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string BasePort::PortTypeString(PortType portType)
{
    if (portType == PORT_FIREWIRE)
        return std::string("Firewire");
    else if (portType == PORT_ETH_RAW)
        return std::string("Ethernet-Raw");
    else if (portType == PORT_ETH_UDP)
        return std::string("Ethernet-UDP");
    else if (portType == PORT_ZYNQ_EMIO)
        return std::string("Zynq-EMIO");
    else
        return std::string("Unknown");
}